

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_type.h
# Opt level: O0

void __thiscall
density::
runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>::
destroy(runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
        *this,void *i_dest)

{
  bool bVar1;
  f_destroy *this_00;
  void *i_dest_local;
  runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *this_local;
  
  bVar1 = empty(this);
  if (bVar1) {
    density_tests::detail::assert_failed<>
              ("!empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/runtime_type.h"
               ,0x3b0);
  }
  this_00 = get_feature<density::f_destroy>(this);
  f_destroy::operator()(this_00,i_dest);
  return;
}

Assistant:

void destroy(void * i_dest) const noexcept
        {
            DENSITY_ASSERT(!empty());
            get_feature<f_destroy>()(i_dest);
        }